

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_strauss_wnaf
               (secp256k1_strauss_state *state,secp256k1_gej *r,size_t num,secp256k1_gej *a,
               secp256k1_scalar *na,secp256k1_scalar *ng)

{
  uint64_t *puVar1;
  long *plVar2;
  long *plVar3;
  secp256k1_strauss_point_state *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  secp256k1_ge *psVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  uint uVar175;
  int iVar176;
  uint uVar177;
  ulong in_RAX;
  ulong extraout_RAX;
  ulong uVar178;
  uint uVar179;
  long lVar180;
  ulong uVar181;
  ulong uVar182;
  secp256k1_gej *psVar183;
  long lVar184;
  long lVar185;
  secp256k1_fe *psVar186;
  long lVar187;
  secp256k1_gej *psVar188;
  ulong *puVar189;
  undefined8 *puVar190;
  secp256k1_gej *psVar191;
  secp256k1_fe *psVar192;
  ulong *puVar193;
  undefined8 *puVar194;
  ulong uVar195;
  ulong uVar196;
  ulong uVar197;
  long lVar198;
  long lVar199;
  long lVar200;
  byte bVar201;
  undefined1 auVar202 [16];
  secp256k1_scalar na_lam;
  uint64_t tmp3;
  secp256k1_fe Z;
  uint64_t tmp3_2;
  uint64_t tmp2_2;
  uint64_t tmp2;
  uint64_t tmp1;
  int wnaf_ng_128 [129];
  int wnaf_ng_1 [129];
  long local_558;
  long local_548;
  long local_540;
  undefined1 local_538 [64];
  long lStack_4f8;
  uint64_t local_4f0;
  int local_4e8;
  secp256k1_gej *local_4d8;
  secp256k1_scalar *local_4d0;
  ulong local_4c8;
  undefined1 local_4c0 [16];
  ulong uStack_4b0;
  undefined1 local_4a8 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  ulong local_468;
  uint64_t uStack_460;
  undefined1 local_458 [16];
  secp256k1_scalar local_448 [16];
  uint uStack_23c;
  secp256k1_gej local_238 [4];
  
  bVar201 = 0;
  local_4c0._0_8_ = 1;
  stack0xfffffffffffffb48 = (undefined1  [16])0x0;
  local_4a8 = (undefined1  [16])0x0;
  local_4d8 = r;
  local_4d0 = ng;
  if (num == 0) {
    uVar179 = 0;
    lVar198 = 0;
  }
  else {
    psVar186 = &a->z;
    lVar198 = 0;
    uVar179 = 0;
    do {
      iVar176 = (int)a;
      auVar202._0_4_ = -(uint)((int)na->d[2] == 0 && (int)na->d[0] == 0);
      auVar202._4_4_ = -(uint)(*(int *)((long)na->d + 0x14) == 0 && *(int *)((long)na->d + 4) == 0);
      auVar202._8_4_ = -(uint)((int)na->d[3] == 0 && (int)na->d[1] == 0);
      auVar202._12_4_ =
           -(uint)(*(int *)((long)na->d + 0x1c) == 0 && *(int *)((long)na->d + 0xc) == 0);
      uVar175 = movmskps((int)in_RAX,auVar202);
      in_RAX = (ulong)(uVar175 ^ 0xf);
      if (((uVar175 ^ 0xf) != 0) && (*(int *)(psVar186 + 1) == 0)) {
        psVar183 = (secp256k1_gej *)state;
        secp256k1_scalar_split_lambda(local_448,(secp256k1_scalar *)local_538,na);
        iVar176 = secp256k1_ecmult_wnaf
                            (state->ps[lVar198].wnaf_na_1,(int)local_448,(secp256k1_scalar *)0x5,
                             iVar176);
        psVar4 = state->ps;
        psVar4[lVar198].bits_na_1 = iVar176;
        a = local_238;
        uVar177 = secp256k1_ecmult_wnaf
                            (psVar4[lVar198].wnaf_na_lam,(int)(secp256k1_scalar *)local_538,
                             (secp256k1_scalar *)0x5,(int)psVar4);
        psVar4 = state->ps;
        psVar4[lVar198].bits_na_lam = uVar177;
        uVar175 = psVar4[lVar198].bits_na_1;
        if ((int)uVar179 < (int)uVar175) {
          uVar179 = uVar175;
        }
        if ((int)uVar179 < (int)uVar177) {
          uVar179 = uVar177;
        }
        psVar188 = (secp256k1_gej *)(psVar186 + -2);
        psVar191 = a;
        for (lVar180 = 0x10; lVar180 != 0; lVar180 = lVar180 + -1) {
          (psVar191->x).n[0] = (psVar188->x).n[0];
          psVar188 = (secp256k1_gej *)((long)psVar188 + (ulong)bVar201 * -0x10 + 8);
          psVar191 = (secp256k1_gej *)((long)psVar191 + (ulong)bVar201 * -0x10 + 8);
        }
        if (lVar198 != 0) {
          secp256k1_gej_rescale(a,(secp256k1_fe *)local_4c0);
        }
        secp256k1_ecmult_odd_multiples_table
                  ((int)lVar198 * 0x2c0 + (int)state->pre_a,
                   (secp256k1_ge *)(state->aux + lVar198 * 8),(secp256k1_fe *)local_4c0,&a->x,
                   psVar183);
        in_RAX = extraout_RAX;
        if (lVar198 != 0) {
          psVar192 = state->aux + lVar198 * 8;
          uVar182 = psVar192->n[0];
          uVar196 = psVar192->n[1];
          uVar5 = psVar192->n[2];
          uVar6 = psVar192->n[3];
          uVar7 = psVar192->n[4];
          auVar10._8_8_ = 0;
          auVar10._0_8_ = psVar186->n[0];
          auVar75._8_8_ = 0;
          auVar75._0_8_ = uVar6;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = psVar186->n[1];
          auVar76._8_8_ = 0;
          auVar76._0_8_ = uVar5;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = psVar186->n[2];
          auVar77._8_8_ = 0;
          auVar77._0_8_ = uVar196;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = psVar186->n[3];
          auVar78._8_8_ = 0;
          auVar78._0_8_ = uVar182;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = psVar186->n[4];
          auVar79._8_8_ = 0;
          auVar79._0_8_ = uVar7;
          uVar178 = SUB168(auVar14 * auVar79,0);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar178 & 0xfffffffffffff;
          auVar202 = auVar11 * auVar76 + auVar10 * auVar75 + auVar12 * auVar77 + auVar13 * auVar78 +
                     auVar15 * ZEXT816(0x1000003d10);
          uVar181 = auVar202._0_8_;
          local_468 = uVar181 & 0xfffffffffffff;
          auVar153._8_8_ = 0;
          auVar153._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = psVar186->n[0];
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar7;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = psVar186->n[1];
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar6;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = psVar186->n[2];
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar5;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = psVar186->n[3];
          auVar83._8_8_ = 0;
          auVar83._0_8_ = uVar196;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = psVar186->n[4];
          auVar84._8_8_ = 0;
          auVar84._0_8_ = uVar182;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = uVar178 >> 0x34 | SUB168(auVar14 * auVar79,8) << 0xc;
          auVar202 = auVar16 * auVar80 + auVar153 + auVar17 * auVar81 + auVar18 * auVar82 +
                     auVar19 * auVar83 + auVar20 * auVar84 + auVar21 * ZEXT816(0x1000003d10);
          uVar178 = auVar202._0_8_;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = uVar178 >> 0x34 | auVar202._8_8_ << 0xc;
          local_4c8 = (uVar178 & 0xfffffffffffff) >> 0x30;
          local_488._0_8_ = uVar178 & 0xffffffffffff;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = psVar186->n[0];
          auVar85._8_8_ = 0;
          auVar85._0_8_ = uVar182;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = psVar186->n[1];
          auVar86._8_8_ = 0;
          auVar86._0_8_ = uVar7;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = psVar186->n[2];
          auVar87._8_8_ = 0;
          auVar87._0_8_ = uVar6;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = psVar186->n[3];
          auVar88._8_8_ = 0;
          auVar88._0_8_ = uVar5;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = psVar186->n[4];
          auVar89._8_8_ = 0;
          auVar89._0_8_ = uVar196;
          auVar202 = auVar23 * auVar86 + auVar154 + auVar24 * auVar87 + auVar25 * auVar88 +
                     auVar26 * auVar89;
          uVar181 = auVar202._0_8_;
          auVar156._8_8_ = 0;
          auVar156._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
          auVar90._8_8_ = 0;
          auVar90._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | local_4c8;
          auVar202 = auVar22 * auVar85 + ZEXT816(0x1000003d1) * auVar90;
          uVar181 = auVar202._0_8_;
          psVar192->n[0] = uVar181 & 0xfffffffffffff;
          auVar155._8_8_ = 0;
          auVar155._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = psVar186->n[0];
          auVar91._8_8_ = 0;
          auVar91._0_8_ = uVar196;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = psVar186->n[1];
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar182;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = psVar186->n[2];
          auVar93._8_8_ = 0;
          auVar93._0_8_ = uVar7;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = psVar186->n[3];
          auVar94._8_8_ = 0;
          auVar94._0_8_ = uVar6;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = psVar186->n[4];
          auVar95._8_8_ = 0;
          auVar95._0_8_ = uVar5;
          auVar10 = auVar29 * auVar93 + auVar156 + auVar30 * auVar94 + auVar31 * auVar95;
          uVar181 = auVar10._0_8_;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = uVar181 & 0xfffffffffffff;
          auVar202 = auVar27 * auVar91 + auVar155 + auVar28 * auVar92 +
                     auVar32 * ZEXT816(0x1000003d10);
          uVar195 = auVar202._0_8_;
          auVar158._8_8_ = 0;
          auVar158._0_8_ = uVar181 >> 0x34 | auVar10._8_8_ << 0xc;
          psVar192->n[1] = uVar195 & 0xfffffffffffff;
          auVar157._8_8_ = 0;
          auVar157._0_8_ = uVar195 >> 0x34 | auVar202._8_8_ << 0xc;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = psVar186->n[0];
          auVar96._8_8_ = 0;
          auVar96._0_8_ = uVar5;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = psVar186->n[1];
          auVar97._8_8_ = 0;
          auVar97._0_8_ = uVar196;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = psVar186->n[2];
          auVar98._8_8_ = 0;
          auVar98._0_8_ = uVar182;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = psVar186->n[3];
          auVar99._8_8_ = 0;
          auVar99._0_8_ = uVar7;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = psVar186->n[4];
          auVar100._8_8_ = 0;
          auVar100._0_8_ = uVar6;
          auVar10 = auVar36 * auVar99 + auVar158 + auVar37 * auVar100;
          uVar182 = auVar10._0_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = uVar182 & 0xfffffffffffff;
          auVar202 = auVar33 * auVar96 + auVar157 + auVar34 * auVar97 + auVar35 * auVar98 +
                     auVar38 * ZEXT816(0x1000003d10);
          uVar196 = auVar202._0_8_;
          a = (secp256k1_gej *)(uVar182 >> 0x34 | auVar10._8_8_ << 0xc);
          psVar192->n[2] = uVar196 & 0xfffffffffffff;
          auVar159._8_8_ = 0;
          auVar159._0_8_ = (uVar196 >> 0x34 | auVar202._8_8_ << 0xc) + local_468;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = a;
          auVar159 = auVar39 * ZEXT816(0x1000003d10) + auVar159;
          uVar182 = auVar159._0_8_;
          in_RAX = uVar182 & 0xfffffffffffff;
          psVar192->n[3] = in_RAX;
          psVar192->n[4] = (uVar182 >> 0x34 | auVar159._8_8_ << 0xc) + (uVar178 & 0xffffffffffff);
        }
        lVar198 = lVar198 + 1;
      }
      psVar186 = (secp256k1_fe *)((long)(psVar186 + 3) + 8);
      na = na + 1;
      num = num - 1;
    } while (num != 0);
  }
  if (lVar198 != 0) {
    secp256k1_ge_table_set_globalz(lVar198 * 8,state->pre_a,state->aux);
    lVar180 = 0;
    a = (secp256k1_gej *)0x0;
    lVar185 = 0;
    do {
      lVar187 = 0;
      psVar183 = a;
      do {
        puVar193 = (ulong *)((long)state->aux->n + lVar187 + lVar180);
        puVar189 = (ulong *)((long)(state->pre_a->x).n + (long)(psVar183->x).n);
        uVar182 = *puVar189;
        uVar196 = puVar189[1];
        uVar5 = puVar189[2];
        uVar6 = puVar189[3];
        uVar7 = puVar189[4];
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar6;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar5;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar196;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar182;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar7;
        uVar178 = SUB168(ZEXT816(0x7ae96a2b657c) * auVar105,0);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar178 & 0xfffffffffffff;
        auVar202 = ZEXT816(0x7512f58995c13) * auVar102 + ZEXT816(0x96c28719501ee) * auVar101 +
                   ZEXT816(0xc3434e99cf049) * auVar103 + ZEXT816(0x7106e64479ea) * auVar104 +
                   auVar40 * ZEXT816(0x1000003d10);
        uVar181 = auVar202._0_8_;
        local_238[0].x.n[0] = uVar181 & 0xfffffffffffff;
        auVar160._8_8_ = 0;
        auVar160._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar7;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar6;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar5;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar196;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = uVar182;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar178 >> 0x34 | SUB168(ZEXT816(0x7ae96a2b657c) * auVar105,8) << 0xc;
        auVar202 = ZEXT816(0x96c28719501ee) * auVar106 + auVar160 +
                   ZEXT816(0x7512f58995c13) * auVar107 + ZEXT816(0xc3434e99cf049) * auVar108 +
                   ZEXT816(0x7106e64479ea) * auVar109 + ZEXT816(0x7ae96a2b657c) * auVar110 +
                   auVar41 * ZEXT816(0x1000003d10);
        uVar178 = auVar202._0_8_;
        auVar161._8_8_ = 0;
        auVar161._0_8_ = uVar178 >> 0x34 | auVar202._8_8_ << 0xc;
        local_538._0_8_ = (uVar178 & 0xfffffffffffff) >> 0x30;
        local_448[0].d[0] = uVar178 & 0xffffffffffff;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar182;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar7;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar6;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar5;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar196;
        auVar202 = ZEXT816(0x7512f58995c13) * auVar112 + auVar161 +
                   ZEXT816(0xc3434e99cf049) * auVar113 + ZEXT816(0x7106e64479ea) * auVar114 +
                   ZEXT816(0x7ae96a2b657c) * auVar115;
        uVar181 = auVar202._0_8_;
        auVar163._8_8_ = 0;
        auVar163._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | local_538._0_8_;
        auVar202 = ZEXT816(0x96c28719501ee) * auVar111 + ZEXT816(0x1000003d1) * auVar116;
        uVar181 = auVar202._0_8_;
        *puVar193 = uVar181 & 0xfffffffffffff;
        auVar162._8_8_ = 0;
        auVar162._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = uVar196;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar182;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar7;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar6;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar5;
        auVar10 = ZEXT816(0xc3434e99cf049) * auVar119 + auVar163 +
                  ZEXT816(0x7106e64479ea) * auVar120 + ZEXT816(0x7ae96a2b657c) * auVar121;
        uVar181 = auVar10._0_8_;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar181 & 0xfffffffffffff;
        auVar202 = ZEXT816(0x96c28719501ee) * auVar117 + auVar162 +
                   ZEXT816(0x7512f58995c13) * auVar118 + auVar42 * ZEXT816(0x1000003d10);
        uVar195 = auVar202._0_8_;
        auVar165._8_8_ = 0;
        auVar165._0_8_ = uVar181 >> 0x34 | auVar10._8_8_ << 0xc;
        puVar193[1] = uVar195 & 0xfffffffffffff;
        auVar164._8_8_ = 0;
        auVar164._0_8_ = uVar195 >> 0x34 | auVar202._8_8_ << 0xc;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar5;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar196;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar182;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar7;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar6;
        auVar10 = ZEXT816(0x7106e64479ea) * auVar125 + auVar165 + ZEXT816(0x7ae96a2b657c) * auVar126
        ;
        uVar182 = auVar10._0_8_;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = uVar182 & 0xfffffffffffff;
        auVar202 = ZEXT816(0x96c28719501ee) * auVar122 + auVar164 +
                   ZEXT816(0x7512f58995c13) * auVar123 + ZEXT816(0xc3434e99cf049) * auVar124 +
                   auVar43 * ZEXT816(0x1000003d10);
        uVar196 = auVar202._0_8_;
        puVar193[2] = uVar196 & 0xfffffffffffff;
        auVar166._8_8_ = 0;
        auVar166._0_8_ = (uVar196 >> 0x34 | auVar202._8_8_ << 0xc) + local_238[0].x.n[0];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar182 >> 0x34 | auVar10._8_8_ << 0xc;
        auVar166 = auVar44 * ZEXT816(0x1000003d10) + auVar166;
        uVar182 = auVar166._0_8_;
        puVar193[3] = uVar182 & 0xfffffffffffff;
        puVar193[4] = (uVar182 >> 0x34 | auVar166._8_8_ << 0xc) + (uVar178 & 0xffffffffffff);
        psVar183 = (secp256k1_gej *)((psVar183->z).n + 1);
        lVar187 = lVar187 + 0x28;
      } while (lVar187 != 0x140);
      lVar185 = lVar185 + 1;
      a = (secp256k1_gej *)(a[5].y.n + 3);
      lVar180 = lVar180 + 0x140;
    } while (lVar185 != lVar198);
  }
  iVar176 = (int)a;
  if (local_4d0 == (secp256k1_scalar *)0x0) {
    local_540 = 0;
    local_548 = 0;
  }
  else {
    local_468 = local_4d0->d[0];
    uStack_460 = local_4d0->d[1];
    local_458 = (undefined1  [16])0x0;
    local_488 = *(undefined1 (*) [16])(local_4d0->d + 2);
    local_478 = (undefined1  [16])0x0;
    uVar175 = secp256k1_ecmult_wnaf
                        ((int *)local_238,(int)&local_468,(secp256k1_scalar *)0xf,iVar176);
    uVar177 = secp256k1_ecmult_wnaf((int *)local_448,(int)local_488,(secp256k1_scalar *)0xf,iVar176)
    ;
    if ((int)uVar179 < (int)uVar175) {
      uVar179 = uVar175;
    }
    if ((int)uVar179 < (int)uVar177) {
      uVar179 = uVar177;
    }
    local_548 = (long)(int)uVar177;
    local_540 = (long)(int)uVar175;
  }
  psVar183 = local_4d8;
  local_4d8->infinity = 1;
  (psVar183->x).n[0] = 0;
  (psVar183->x).n[1] = 0;
  (psVar183->x).n[2] = 0;
  (psVar183->x).n[3] = 0;
  *(undefined1 (*) [16])((local_4d8->x).n + 4) = (undefined1  [16])0x0;
  (psVar183->y).n[1] = 0;
  (psVar183->y).n[2] = 0;
  (psVar183->y).n[3] = 0;
  (psVar183->y).n[4] = 0;
  (psVar183->z).n[0] = 0;
  (psVar183->z).n[1] = 0;
  (psVar183->z).n[2] = 0;
  (psVar183->z).n[3] = 0;
  (local_4d8->z).n[4] = 0;
  if (0 < (int)uVar179) {
    local_558 = (ulong)uVar179 * 4;
    uVar182 = (ulong)uVar179;
    do {
      local_558 = local_558 + -4;
      if (psVar183->infinity == 0) {
        secp256k1_gej_double(psVar183,psVar183);
      }
      else {
        psVar183->infinity = 1;
        (psVar183->x).n[0] = 0;
        (psVar183->x).n[1] = 0;
        (psVar183->x).n[2] = 0;
        (psVar183->x).n[3] = 0;
        *(undefined1 (*) [16])((psVar183->x).n + 4) = (undefined1  [16])0x0;
        (psVar183->y).n[1] = 0;
        (psVar183->y).n[2] = 0;
        (psVar183->y).n[3] = 0;
        (psVar183->y).n[4] = 0;
        (psVar183->z).n[0] = 0;
        (psVar183->z).n[1] = 0;
        (psVar183->z).n[2] = 0;
        (psVar183->z).n[3] = 0;
        (psVar183->z).n[4] = 0;
      }
      if (lVar198 != 0) {
        lVar200 = 0x40c;
        lVar199 = 0;
        lVar187 = 0;
        lVar180 = local_558;
        lVar185 = lVar198;
        do {
          if (((long)uVar182 <= (long)*(int *)((long)state->ps->wnaf_na_1 + lVar200 + -4)) &&
             (uVar179 = *(uint *)((long)state->ps->wnaf_na_1 + lVar180), uVar179 != 0)) {
            if ((int)uVar179 < 1) {
              puVar190 = (undefined8 *)((long)state->pre_a[~uVar179 >> 1].x.n + lVar187);
              puVar194 = (undefined8 *)local_538;
              for (lVar184 = 0xb; lVar184 != 0; lVar184 = lVar184 + -1) {
                *puVar194 = *puVar190;
                puVar190 = puVar190 + (ulong)bVar201 * -2 + 1;
                puVar194 = puVar194 + (ulong)bVar201 * -2 + 1;
              }
              local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
              local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
              lVar184 = local_538._56_8_;
              lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
              local_538._56_8_ = 0x3ffffffffffffc - lVar184;
              local_4f0 = 0x3fffffffffffc - local_4f0;
            }
            else {
              puVar190 = (undefined8 *)((long)state->pre_a[uVar179 - 1 >> 1].x.n + lVar187);
              puVar194 = (undefined8 *)local_538;
              for (lVar184 = 0xb; lVar184 != 0; lVar184 = lVar184 + -1) {
                *puVar194 = *puVar190;
                puVar190 = puVar190 + (ulong)bVar201 * -2 + 1;
                puVar194 = puVar194 + (ulong)bVar201 * -2 + 1;
              }
            }
            secp256k1_gej_add_ge_var
                      (psVar183,psVar183,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
          }
          if (((long)uVar182 <= (long)*(int *)((long)state->ps->wnaf_na_1 + lVar200)) &&
             (uVar179 = *(uint *)((long)state->ps->wnaf_na_lam + lVar180), uVar179 != 0)) {
            psVar186 = state->aux;
            psVar8 = state->pre_a;
            if ((int)uVar179 < 1) {
              uVar179 = ~uVar179 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar186[uVar179].n + lVar199 + 0x20);
              puVar189 = (ulong *)((long)psVar186[uVar179].n + lVar199);
              local_538._0_8_ = *puVar189;
              local_538._8_8_ = puVar189[1];
              puVar1 = (uint64_t *)((long)psVar186[uVar179].n + lVar199 + 0x10);
              local_538._16_8_ = *puVar1;
              local_538._24_8_ = puVar1[1];
              plVar2 = (long *)((long)psVar8[uVar179].y.n + lVar187);
              plVar3 = (long *)((long)psVar8[uVar179].y.n + lVar187 + 0x10);
              local_538._40_8_ = 0x3ffffbfffff0bc - *plVar2;
              local_538._48_8_ = 0x3ffffffffffffc - plVar2[1];
              lStack_4f8 = 0x3ffffffffffffc - plVar3[1];
              local_538._56_8_ = 0x3ffffffffffffc - *plVar3;
              local_4f0 = 0x3fffffffffffc - *(long *)((long)psVar8[uVar179].y.n + lVar187 + 0x20);
            }
            else {
              uVar179 = uVar179 - 1 >> 1;
              local_538._32_8_ = *(uint64_t *)((long)psVar186[uVar179].n + lVar199 + 0x20);
              puVar189 = (ulong *)((long)psVar186[uVar179].n + lVar199);
              local_538._0_8_ = *puVar189;
              local_538._8_8_ = puVar189[1];
              puVar1 = (uint64_t *)((long)psVar186[uVar179].n + lVar199 + 0x10);
              local_538._16_8_ = *puVar1;
              local_538._24_8_ = puVar1[1];
              puVar1 = (uint64_t *)((long)psVar8[uVar179].y.n + lVar187);
              local_538._40_8_ = *puVar1;
              local_538._48_8_ = puVar1[1];
              unique0x00006c80 = *(undefined1 (*) [16])((long)psVar8[uVar179].y.n + lVar187 + 0x10);
              local_4f0 = *(uint64_t *)((long)psVar8[uVar179].y.n + lVar187 + 0x20);
            }
            local_4e8 = 0;
            secp256k1_gej_add_ge_var
                      (psVar183,psVar183,(secp256k1_ge *)local_538,(secp256k1_fe *)0x0);
          }
          lVar180 = lVar180 + 0x410;
          lVar200 = lVar200 + 0x410;
          lVar187 = lVar187 + 0x2c0;
          lVar199 = lVar199 + 0x140;
          lVar185 = lVar185 + -1;
        } while (lVar185 != 0);
      }
      if (((long)uVar182 <= local_540) &&
         (uVar179 = *(uint *)((long)local_238[0].x.n + uVar182 * 4 + -4), uVar179 != 0)) {
        if ((int)uVar179 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (~uVar179 >> 1));
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar180 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar180;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g + (uVar179 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar183,psVar183,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4c0);
      }
      if (((long)uVar182 <= local_548) &&
         (uVar179 = *(uint *)((long)local_448[0].d + uVar182 * 4 + -4), uVar179 != 0)) {
        if ((int)uVar179 < 1) {
          secp256k1_ge_from_storage((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (~uVar179 >> 1))
          ;
          local_538._40_8_ = 0x3ffffbfffff0bc - local_538._40_8_;
          local_538._48_8_ = 0x3ffffffffffffc - local_538._48_8_;
          lVar180 = local_538._56_8_;
          lStack_4f8 = 0x3ffffffffffffc - local_538._64_8_;
          local_538._56_8_ = 0x3ffffffffffffc - lVar180;
          local_4f0 = 0x3fffffffffffc - local_4f0;
        }
        else {
          secp256k1_ge_from_storage
                    ((secp256k1_ge *)local_538,secp256k1_pre_g_128 + (uVar179 - 1 >> 1));
        }
        secp256k1_gej_add_zinv_var
                  (psVar183,psVar183,(secp256k1_ge *)local_538,(secp256k1_fe *)local_4c0);
      }
      bVar9 = 1 < (long)uVar182;
      uVar182 = uVar182 - 1;
    } while (bVar9);
  }
  if (psVar183->infinity == 0) {
    uVar182 = (psVar183->z).n[0];
    uVar196 = (psVar183->z).n[1];
    uVar5 = (psVar183->z).n[2];
    uVar6 = (psVar183->z).n[3];
    uVar7 = (psVar183->z).n[4];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = local_4c0._0_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar6;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_4c0._8_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar5;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uStack_4b0;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar196;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = local_4a8._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar182;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_4a8._8_8_;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar7;
    uVar178 = SUB168(auVar49 * auVar131,0);
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar178 & 0xfffffffffffff;
    auVar202 = auVar46 * auVar128 + auVar45 * auVar127 + auVar47 * auVar129 + auVar48 * auVar130 +
               auVar50 * ZEXT816(0x1000003d10);
    uVar181 = auVar202._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar181 >> 0x34 | auVar202._8_8_ << 0xc;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_4c0._0_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar7;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_4c0._8_8_;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = uVar6;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uStack_4b0;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = uVar5;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = local_4a8._0_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = uVar196;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = local_4a8._8_8_;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar182;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar178 >> 0x34 | SUB168(auVar49 * auVar131,8) << 0xc;
    auVar202 = auVar51 * auVar132 + auVar167 + auVar52 * auVar133 + auVar53 * auVar134 +
               auVar54 * auVar135 + auVar55 * auVar136 + auVar56 * ZEXT816(0x1000003d10);
    uVar178 = auVar202._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar178 >> 0x34 | auVar202._8_8_ << 0xc;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = local_4c0._0_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar182;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_4c0._8_8_;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = uVar7;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uStack_4b0;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = uVar6;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = local_4a8._0_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar5;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = local_4a8._8_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar196;
    auVar202 = auVar58 * auVar138 + auVar169 + auVar59 * auVar139 + auVar60 * auVar140 +
               auVar61 * auVar141;
    uVar195 = auVar202._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar195 >> 0x34 | auVar202._8_8_ << 0xc;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = (uVar195 & 0xfffffffffffff) << 4 | (uVar178 & 0xfffffffffffff) >> 0x30;
    uVar195 = auVar168._0_8_;
    auVar168 = auVar57 * auVar137 + ZEXT816(0x1000003d1) * auVar142;
    (psVar183->z).n[0] = uVar195 & 0xfffffffffffff;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar195 >> 0x34 | auVar168._8_8_ << 0xc;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = local_4c0._0_8_;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = uVar196;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = local_4c0._8_8_;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar182;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uStack_4b0;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uVar7;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = local_4a8._0_8_;
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar6;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = local_4a8._8_8_;
    auVar147._8_8_ = 0;
    auVar147._0_8_ = uVar5;
    auVar10 = auVar64 * auVar145 + auVar171 + auVar65 * auVar146 + auVar66 * auVar147;
    uVar195 = auVar10._0_8_;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar195 & 0xfffffffffffff;
    auVar202 = auVar62 * auVar143 + auVar170 + auVar63 * auVar144 + auVar67 * ZEXT816(0x1000003d10);
    uVar197 = auVar202._0_8_;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar195 >> 0x34 | auVar10._8_8_ << 0xc;
    (psVar183->z).n[1] = uVar197 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = uVar197 >> 0x34 | auVar202._8_8_ << 0xc;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = local_4c0._0_8_;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uVar5;
    auVar69._8_8_ = 0;
    auVar69._0_8_ = local_4c0._8_8_;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar196;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uStack_4b0;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar182;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_4a8._0_8_;
    auVar151._8_8_ = 0;
    auVar151._0_8_ = uVar7;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_4a8._8_8_;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar6;
    auVar10 = auVar71 * auVar151 + auVar173 + auVar72 * auVar152;
    uVar182 = auVar10._0_8_;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar182 & 0xfffffffffffff;
    auVar202 = auVar68 * auVar148 + auVar172 + auVar69 * auVar149 + auVar70 * auVar150 +
               auVar73 * ZEXT816(0x1000003d10);
    uVar196 = auVar202._0_8_;
    (psVar183->z).n[2] = uVar196 & 0xfffffffffffff;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = (uVar196 >> 0x34 | auVar202._8_8_ << 0xc) + (uVar181 & 0xfffffffffffff);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar182 >> 0x34 | auVar10._8_8_ << 0xc;
    auVar174 = auVar74 * ZEXT816(0x1000003d10) + auVar174;
    uVar182 = auVar174._0_8_;
    (psVar183->z).n[3] = uVar182 & 0xfffffffffffff;
    (psVar183->z).n[4] = (uVar182 >> 0x34 | auVar174._8_8_ << 0xc) + (uVar178 & 0xffffffffffff);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_strauss_wnaf(const struct secp256k1_strauss_state *state, secp256k1_gej *r, size_t num, const secp256k1_gej *a, const secp256k1_scalar *na, const secp256k1_scalar *ng) {
    secp256k1_ge tmpa;
    secp256k1_fe Z;
    /* Split G factors. */
    secp256k1_scalar ng_1, ng_128;
    int wnaf_ng_1[129];
    int bits_ng_1 = 0;
    int wnaf_ng_128[129];
    int bits_ng_128 = 0;
    int i;
    int bits = 0;
    size_t np;
    size_t no = 0;

    secp256k1_fe_set_int(&Z, 1);
    for (np = 0; np < num; ++np) {
        secp256k1_gej tmp;
        secp256k1_scalar na_1, na_lam;
        if (secp256k1_scalar_is_zero(&na[np]) || secp256k1_gej_is_infinity(&a[np])) {
            continue;
        }
        /* split na into na_1 and na_lam (where na = na_1 + na_lam*lambda, and na_1 and na_lam are ~128 bit) */
        secp256k1_scalar_split_lambda(&na_1, &na_lam, &na[np]);

        /* build wnaf representation for na_1 and na_lam. */
        state->ps[no].bits_na_1   = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_1,   129, &na_1,   WINDOW_A);
        state->ps[no].bits_na_lam = secp256k1_ecmult_wnaf(state->ps[no].wnaf_na_lam, 129, &na_lam, WINDOW_A);
        VERIFY_CHECK(state->ps[no].bits_na_1 <= 129);
        VERIFY_CHECK(state->ps[no].bits_na_lam <= 129);
        if (state->ps[no].bits_na_1 > bits) {
            bits = state->ps[no].bits_na_1;
        }
        if (state->ps[no].bits_na_lam > bits) {
            bits = state->ps[no].bits_na_lam;
        }

        /* Calculate odd multiples of a.
         * All multiples are brought to the same Z 'denominator', which is stored
         * in Z. Due to secp256k1' isomorphism we can do all operations pretending
         * that the Z coordinate was 1, use affine addition formulae, and correct
         * the Z coordinate of the result once at the end.
         * The exception is the precomputed G table points, which are actually
         * affine. Compared to the base used for other points, they have a Z ratio
         * of 1/Z, so we can use secp256k1_gej_add_zinv_var, which uses the same
         * isomorphism to efficiently add with a known Z inverse.
         */
        tmp = a[np];
        if (no) {
            secp256k1_gej_rescale(&tmp, &Z);
        }
        secp256k1_ecmult_odd_multiples_table(ECMULT_TABLE_SIZE(WINDOW_A), state->pre_a + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &Z, &tmp);
        if (no) secp256k1_fe_mul(state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + no * ECMULT_TABLE_SIZE(WINDOW_A), &(a[np].z));

        ++no;
    }

    /* Bring them to the same Z denominator. */
    if (no) {
        secp256k1_ge_table_set_globalz(ECMULT_TABLE_SIZE(WINDOW_A) * no, state->pre_a, state->aux);
    }

    for (np = 0; np < no; ++np) {
        for (i = 0; i < ECMULT_TABLE_SIZE(WINDOW_A); i++) {
            secp256k1_fe_mul(&state->aux[np * ECMULT_TABLE_SIZE(WINDOW_A) + i], &state->pre_a[np * ECMULT_TABLE_SIZE(WINDOW_A) + i].x, &secp256k1_const_beta);
        }
    }

    if (ng) {
        /* split ng into ng_1 and ng_128 (where gn = gn_1 + gn_128*2^128, and gn_1 and gn_128 are ~128 bit) */
        secp256k1_scalar_split_128(&ng_1, &ng_128, ng);

        /* Build wnaf representation for ng_1 and ng_128 */
        bits_ng_1   = secp256k1_ecmult_wnaf(wnaf_ng_1,   129, &ng_1,   WINDOW_G);
        bits_ng_128 = secp256k1_ecmult_wnaf(wnaf_ng_128, 129, &ng_128, WINDOW_G);
        if (bits_ng_1 > bits) {
            bits = bits_ng_1;
        }
        if (bits_ng_128 > bits) {
            bits = bits_ng_128;
        }
    }

    secp256k1_gej_set_infinity(r);

    for (i = bits - 1; i >= 0; i--) {
        int n;
        secp256k1_gej_double_var(r, r, NULL);
        for (np = 0; np < no; ++np) {
            if (i < state->ps[np].bits_na_1 && (n = state->ps[np].wnaf_na_1[i])) {
                secp256k1_ecmult_table_get_ge(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
            if (i < state->ps[np].bits_na_lam && (n = state->ps[np].wnaf_na_lam[i])) {
                secp256k1_ecmult_table_get_ge_lambda(&tmpa, state->pre_a + np * ECMULT_TABLE_SIZE(WINDOW_A), state->aux + np * ECMULT_TABLE_SIZE(WINDOW_A), n, WINDOW_A);
                secp256k1_gej_add_ge_var(r, r, &tmpa, NULL);
            }
        }
        if (i < bits_ng_1 && (n = wnaf_ng_1[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
        if (i < bits_ng_128 && (n = wnaf_ng_128[i])) {
            secp256k1_ecmult_table_get_ge_storage(&tmpa, secp256k1_pre_g_128, n, WINDOW_G);
            secp256k1_gej_add_zinv_var(r, r, &tmpa, &Z);
        }
    }

    if (!r->infinity) {
        secp256k1_fe_mul(&r->z, &r->z, &Z);
    }
}